

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O3

void destroy_cgreen_vector(CgreenVector *vector)

{
  long lVar1;
  
  if ((vector->destructor != (_func_void_void_ptr *)0x0) && (0 < vector->size)) {
    lVar1 = 0;
    do {
      (*vector->destructor)(vector->items[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vector->size);
  }
  free(vector->items);
  free(vector);
  return;
}

Assistant:

void destroy_cgreen_vector(CgreenVector *vector) {
    int i;
    if (vector->destructor != NULL) {
        for (i = 0; i < vector->size; i++) {
            (*vector->destructor)(vector->items[i]);
        }
    }

    free(vector->items);
    vector->items = NULL;
    vector->destructor = NULL;
    vector->size = 0;
    vector->space = 0;

    free(vector);
}